

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::
FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Invoke(FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<void> *pAVar1;
  ArgumentTuple tuple;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  local_8 = args;
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,&local_8);
  pAVar1 = DownCast_<testing::internal::ActionResultHolder<void>*,testing::internal::UntypedActionResultHolderBase>
                     (f);
  if (pAVar1 != (ActionResultHolder<void> *)0x0) {
    (*(pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase[1])(pAVar1);
  }
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }